

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::sessionFIX40Fixture::createSession
          (sessionFIX40Fixture *this,int heartBtInt,int startDay,int endDay)

{
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  BeginString *beginString_00;
  Session *this_00;
  allocator<char> local_801;
  string local_800;
  undefined1 local_7e0 [8];
  DataDictionaryProvider provider;
  TimeRange sessionTime;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  STRING local_328;
  StringField local_308;
  allocator<char> local_2a1;
  STRING local_2a0;
  StringField local_280;
  allocator<char> local_209;
  STRING local_208;
  StringField local_1e8;
  undefined1 local_188 [8];
  SessionID sessionID;
  int endDay_local;
  int startDay_local;
  int heartBtInt_local;
  sessionFIX40Fixture *this_local;
  
  sessionID.m_frozenString.field_2._12_4_ = endDay;
  if ((this->object != (Session *)0x0) && (this->object != (Session *)0x0)) {
    (**(code **)(*(long *)this->object + 8))();
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"FIX.4.0",&local_209);
  FIX::BeginString::BeginString((BeginString *)&local_1e8,&local_208);
  beginString = FIX::StringField::operator_cast_to_string_(&local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"TW",&local_2a1);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_280,&local_2a0);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"ISLD",&local_329);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_308,&local_328);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"",&local_351);
  FIX::SessionID::SessionID((SessionID *)local_188,beginString,senderCompID,targetCompID,&local_350)
  ;
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_308);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  FIX::BeginString::~BeginString((BeginString *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  FIX::TimeRange::TimeRange
            ((TimeRange *)&provider.field_0x440,&(this->super_TestCallback).startTime,
             &(this->super_TestCallback).endTime,startDay,sessionID.m_frozenString.field_2._12_4_);
  FIX::DataDictionaryProvider::DataDictionaryProvider((DataDictionaryProvider *)local_7e0);
  beginString_00 = FIX::SessionID::getBeginString((SessionID *)local_188);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_800,"../spec/FIX40.xml",&local_801);
  FIX::DataDictionaryProvider::addTransportDataDictionary
            ((DataDictionaryProvider *)local_7e0,beginString_00,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  this_00 = (Session *)operator_new(0x848);
  FIX::Session::Session
            (this_00,&(this->super_TestCallback).super_NullApplication.super_Application,
             (MessageStoreFactory *)&this->factory,(SessionID *)local_188,
             (DataDictionaryProvider *)local_7e0,(TimeRange *)&provider.field_0x440,heartBtInt,
             (LogFactory *)0x0);
  this->object = this_00;
  FIX::Session::setResponder(this->object,(Responder *)this);
  FIX::DataDictionaryProvider::~DataDictionaryProvider((DataDictionaryProvider *)local_7e0);
  FIX::TimeRange::~TimeRange((TimeRange *)&provider.field_0x440);
  FIX::SessionID::~SessionID((SessionID *)local_188);
  return;
}

Assistant:

virtual void createSession( int heartBtInt, int startDay = -1 , int endDay = -1 )
  {
    if( object )
      delete object;

    SessionID sessionID( BeginString( "FIX.4.0" ),
                         SenderCompID( "TW" ), TargetCompID( "ISLD" ) );
    TimeRange sessionTime( startTime, endTime, startDay, endDay );

    DataDictionaryProvider provider;
    provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIX40.xml" );

    object = new Session( *this, factory, sessionID, provider,
                           sessionTime, heartBtInt, 0 );
    object->setResponder( this );
  }